

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O3

uint Assimp::FBX::anon_unknown_3::ReadString
               (char **sbegin_out,char **send_out,char *input,char **cursor,char *end,
               bool long_length,bool allow_null)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined3 in_register_00000089;
  string local_48;
  
  if ((ulong)((long)end - (long)*cursor) < (ulong)CONCAT31(in_register_00000089,long_length) * 3 + 1
     ) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"cannot ReadString, out of bounds reading length","");
    TokenizeError(&local_48,(long)*cursor - (long)input);
  }
  if (long_length) {
    uVar3 = ReadWord(input,cursor,end);
  }
  else {
    bVar2 = ReadByte(input,cursor,end);
    uVar3 = (uint)bVar2;
  }
  uVar4 = (ulong)uVar3;
  if (uVar4 <= (ulong)((long)end - (long)*cursor)) {
    *sbegin_out = *cursor;
    pcVar1 = *cursor;
    *cursor = pcVar1 + uVar4;
    *send_out = pcVar1 + uVar4;
    if (uVar4 != 0 && !allow_null) {
      uVar5 = 0;
      do {
        if ((*sbegin_out)[uVar5] == '\0') {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"failed ReadString, unexpected NUL character in string","")
          ;
          TokenizeError(&local_48,(long)*cursor - (long)input);
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    return uVar3;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"cannot ReadString, length is out of bounds","");
  TokenizeError(&local_48,(long)*cursor - (long)input);
}

Assistant:

unsigned int ReadString(const char*& sbegin_out, const char*& send_out, const char* input,
        const char*& cursor, const char* end, bool long_length = false, bool allow_null = false) {
    const uint32_t len_len = long_length ? 4 : 1;
    if(Offset(cursor, end) < len_len) {
        TokenizeError("cannot ReadString, out of bounds reading length",input, cursor);
    }

    const uint32_t length = long_length ? ReadWord(input, cursor, end) : ReadByte(input, cursor, end);

    if (Offset(cursor, end) < length) {
        TokenizeError("cannot ReadString, length is out of bounds",input, cursor);
    }

    sbegin_out = cursor;
    cursor += length;

    send_out = cursor;

    if(!allow_null) {
        for (unsigned int i = 0; i < length; ++i) {
            if(sbegin_out[i] == '\0') {
                TokenizeError("failed ReadString, unexpected NUL character in string",input, cursor);
            }
        }
    }

    return length;
}